

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.c
# Opt level: O1

HT_Timeline * ht_global_timeline_get(void)

{
  long *plVar1;
  long lVar2;
  HT_Timeline *timeline;
  
  lVar2 = __tls_get_addr(&PTR_0010dfa8);
  plVar1 = (long *)(lVar2 + 8);
  if (*plVar1 == 0) {
    timeline = ht_timeline_create(global_timeline_buffer_size,0,1,"HT_GlobalTimeline",
                                  (HT_ErrorCode *)0x0);
    ht_feature_callstack_enable(timeline);
    ht_feature_cached_string_enable(timeline,0);
    *plVar1 = (long)timeline;
    pthread_once(&timeline_once_control,create_key);
    pthread_setspecific(timeline_key,(void *)*plVar1);
  }
  return (HT_Timeline *)*plVar1;
}

Assistant:

HT_Timeline* ht_global_timeline_get(void)
{
    static HT_THREAD_LOCAL HT_Timeline* c_timeline = NULL;

    if (!c_timeline)
    {
        c_timeline = _ht_global_timeline_create();
        pthread_once(&timeline_once_control, create_key);
        pthread_setspecific(timeline_key, c_timeline);
    }

    return c_timeline;
}